

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandReadPla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint fBoth;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint fCheck;
  char *pcVar3;
  uint fZeros;
  
  fZeros = 0;
  Extra_UtilGetoptReset();
  fCheck = 1;
  fBoth = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"zbch"), iVar1 == 99) {
      fCheck = fCheck ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x62) {
      fBoth = fBoth ^ 1;
    }
    else {
      if (iVar1 != 0x7a) goto LAB_002c2083;
      fZeros = fZeros ^ 1;
    }
  }
  if (globalUtilOptind + 1 == argc) {
    if (fZeros == 0 && fBoth == 0) {
      pNtk_00 = Io_Read(argv[globalUtilOptind],IO_FILE_PLA,fCheck,0);
    }
    else {
      pNtk = Io_ReadPla(argv[globalUtilOptind],fZeros,fBoth,fCheck);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        puts("Reading PLA file has failed.");
        return 1;
      }
      pNtk_00 = Abc_NtkToLogic(pNtk);
      Abc_NtkDelete(pNtk);
    }
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
LAB_002c2083:
  fwrite("usage: read_pla [-zbch] <file>\n",0x1f,1,(FILE *)pAbc->Err);
  fwrite("\t         reads the network in PLA\n",0x23,1,(FILE *)pAbc->Err);
  pcVar3 = "off-set";
  pcVar2 = "off-set";
  if (fZeros == 0) {
    pcVar2 = "on-set";
  }
  fprintf((FILE *)pAbc->Err,"\t-z     : toggle reading on-set and off-set [default = %s]\n",pcVar2);
  if (fBoth == 0) {
    pcVar3 = "on-set";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n",pcVar3);
  pcVar2 = "yes";
  if (fCheck == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",pcVar2)
  ;
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandReadPla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fZeros = 0, fBoth = 0, fCheck = 1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "zbch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'z':
                fZeros ^= 1;
                break;
            case 'b':
                fBoth ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    if ( fZeros || fBoth )
    {
        Abc_Ntk_t * pTemp;
        pNtk = Io_ReadPla( pFileName, fZeros, fBoth, fCheck );
        if ( pNtk == NULL )
        {
            printf( "Reading PLA file has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkToLogic( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
    }
    else
        pNtk = Io_Read( pFileName, IO_FILE_PLA, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_pla [-zbch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in PLA\n" );
    fprintf( pAbc->Err, "\t-z     : toggle reading on-set and off-set [default = %s]\n", fZeros? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n", fBoth? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}